

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_expand_mixed.c
# Opt level: O1

void test_expand_mixed(void)

{
  wchar_t wVar1;
  
  extract_reference_file("test_expand.Z");
  extract_reference_file("test_expand.plain");
  wVar1 = systemf("%s %s %s >test.out 2>test.err",testprog,"test_expand.Z","test_expand.plain");
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/cat/test/test_expand_mixed.c"
                      ,L'\x11',0,"0",(long)wVar1,
                      "systemf(\"%s %s %s >test.out 2>test.err\", testprog, reffile1, reffile2)",
                      (void *)0x0);
  assertion_text_file_contents
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/cat/test/test_expand_mixed.c"
             ,L'\x15',"contents of test_expand.Z.\ncontents of test_expand.plain.\n","test.out");
  assertion_empty_file
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/cat/test/test_expand_mixed.c"
             ,L'\x16',"test.err");
  return;
}

Assistant:

DEFINE_TEST(test_expand_mixed)
{
	const char *reffile1 = "test_expand.Z";
	const char *reffile2 = "test_expand.plain";

	extract_reference_file(reffile1);
	extract_reference_file(reffile2);
	assertEqualInt(0, systemf("%s %s %s >test.out 2>test.err",
	    testprog, reffile1, reffile2));

	assertTextFileContents(
	    "contents of test_expand.Z.\n"
	    "contents of test_expand.plain.\n", "test.out");
	assertEmptyFile("test.err");
}